

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_parsing.c
# Opt level: O1

nbt_node * parse_unnamed_tag(nbt_type type,char *name,char **memory,size_t *length)

{
  undefined1 uVar1;
  byte bVar2;
  ushort uVar3;
  int8_t *piVar4;
  ushort *puVar5;
  byte *pbVar6;
  list_head *plVar7;
  int iVar8;
  nbt_node *__ptr;
  undefined1 *puVar9;
  nbt_list *pnVar10;
  char *name_00;
  undefined8 *puVar11;
  nbt_node *pnVar12;
  int *piVar13;
  long lVar14;
  long lVar15;
  int32_t *piVar16;
  int64_t *piVar17;
  nbt_type nVar18;
  undefined1 *puVar19;
  nbt_list *pnVar20;
  size_t sVar21;
  list_head *plVar22;
  nbt_type nVar23;
  undefined1 *puVar24;
  ulong __size;
  int iVar25;
  ulong uVar26;
  bool bVar27;
  int32_t elems;
  undefined8 local_58;
  undefined4 local_50;
  nbt_list *local_48;
  char **local_40;
  list_head *local_38;
  
  __ptr = (nbt_node *)malloc(0x20);
  if (__ptr == (nbt_node *)0x0) {
    piVar13 = __errno_location();
    *piVar13 = -2;
    goto switchD_0010370d_default;
  }
  __ptr->type = type;
  __ptr->name = name;
  switch(type) {
  case TAG_BYTE:
    sVar21 = *length;
    if (sVar21 == 0) goto switchD_0010370d_default;
    piVar4 = *memory;
    (__ptr->payload).tag_byte = *piVar4;
    *memory = piVar4 + 1;
    sVar21 = sVar21 - 1;
    break;
  case TAG_SHORT:
    uVar26 = *length;
    if (uVar26 < 2) goto switchD_0010370d_default;
    puVar5 = (ushort *)*memory;
    uVar3 = *puVar5;
    (__ptr->payload).tag_short = uVar3 << 8 | uVar3 >> 8;
    *memory = (char *)(puVar5 + 1);
    sVar21 = uVar26 - 2;
    break;
  case TAG_INT:
    uVar26 = *length;
    if (uVar26 < 4) goto switchD_0010370d_default;
    piVar16 = (int32_t *)*memory;
    (__ptr->payload).tag_int = *piVar16;
    puVar9 = (undefined1 *)((long)&__ptr->payload + 3);
    lVar14 = -2;
    do {
      uVar1 = *(undefined1 *)((long)&__ptr->payload + lVar14 + 2);
      *(undefined1 *)((long)&__ptr->payload + lVar14 + 2) = *puVar9;
      *puVar9 = uVar1;
      puVar9 = puVar9 + -1;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0);
    goto LAB_001039ce;
  case TAG_LONG:
    uVar26 = *length;
    if (uVar26 < 8) goto switchD_0010370d_default;
    piVar17 = (int64_t *)*memory;
    (__ptr->payload).tag_long = *piVar17;
    puVar9 = (undefined1 *)((long)&__ptr->payload + 7);
    lVar14 = 0;
    do {
      uVar1 = *(undefined1 *)((long)&__ptr->payload + lVar14);
      *(undefined1 *)((long)&__ptr->payload + lVar14) = *puVar9;
      *puVar9 = uVar1;
      puVar9 = puVar9 + -1;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
    goto LAB_00103a90;
  case TAG_FLOAT:
    uVar26 = *length;
    if (uVar26 < 4) goto switchD_0010370d_default;
    piVar16 = (int32_t *)*memory;
    (__ptr->payload).tag_int = *piVar16;
    puVar9 = (undefined1 *)((long)&__ptr->payload + 3);
    lVar14 = -2;
    do {
      uVar1 = *(undefined1 *)((long)&__ptr->payload + lVar14 + 2);
      *(undefined1 *)((long)&__ptr->payload + lVar14 + 2) = *puVar9;
      *puVar9 = uVar1;
      puVar9 = puVar9 + -1;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0);
LAB_001039ce:
    *memory = (char *)(piVar16 + 1);
    sVar21 = uVar26 - 4;
    break;
  case TAG_DOUBLE:
    uVar26 = *length;
    if (uVar26 < 8) goto switchD_0010370d_default;
    piVar17 = (int64_t *)*memory;
    (__ptr->payload).tag_long = *piVar17;
    puVar9 = (undefined1 *)((long)&__ptr->payload + 7);
    lVar14 = 0;
    do {
      uVar1 = *(undefined1 *)((long)&__ptr->payload + lVar14);
      *(undefined1 *)((long)&__ptr->payload + lVar14) = *puVar9;
      *puVar9 = uVar1;
      puVar9 = puVar9 + -1;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
LAB_00103a90:
    *memory = (char *)(piVar17 + 1);
    sVar21 = uVar26 - 8;
    break;
  case TAG_BYTE_ARRAY:
    local_58 = (nbt_list *)0x0;
    uVar26 = *length;
    if (uVar26 < 4) goto LAB_00103def;
    piVar13 = (int *)*memory;
    puVar9 = (undefined1 *)((long)&local_50 + 3);
    local_50 = *piVar13;
    lVar14 = 8;
    do {
      uVar1 = *(undefined1 *)((long)&local_58 + lVar14);
      *(undefined1 *)((long)&local_58 + lVar14) = *puVar9;
      *puVar9 = uVar1;
      lVar14 = lVar14 + 1;
      puVar9 = puVar9 + -1;
    } while (lVar14 != 10);
    piVar13 = piVar13 + 1;
    *memory = (char *)piVar13;
    uVar26 = uVar26 - 4;
    *length = uVar26;
    __size = (ulong)local_50;
    if ((long)__size < 0) goto LAB_00103def;
    local_58 = (nbt_list *)malloc(__size);
    if (local_58 == (nbt_list *)0x0) {
LAB_00103de4:
      piVar13 = __errno_location();
      *piVar13 = -2;
      goto LAB_00103def;
    }
    if (uVar26 < __size) goto LAB_00103def;
    memcpy(local_58,piVar13,__size);
    *memory = (char *)((long)piVar13 + __size);
    *length = uVar26 - __size;
    goto LAB_00103e10;
  case TAG_STRING:
    pnVar20 = (nbt_list *)read_string(memory,length);
    goto LAB_00103dde;
  case TAG_LIST:
    pnVar20 = (nbt_list *)malloc(0x18);
    if (pnVar20 == (nbt_list *)0x0) {
LAB_00103d8b:
      piVar13 = __errno_location();
      *piVar13 = -2;
LAB_00103d96:
      piVar13 = __errno_location();
      if (*piVar13 == 0) {
        *piVar13 = -1;
      }
      nbt_free_list(pnVar20);
      pnVar20 = (nbt_list *)0x0;
    }
    else {
      pnVar12 = (nbt_node *)malloc(0x20);
      pnVar20->data = pnVar12;
      if (pnVar12 == (nbt_node *)0x0) goto LAB_00103d8b;
      plVar22 = &pnVar20->entry;
      (pnVar20->entry).blink = plVar22;
      (pnVar20->entry).flink = plVar22;
      uVar26 = *length;
      if (uVar26 == 0) goto LAB_00103d96;
      pbVar6 = (byte *)*memory;
      nVar23 = (nbt_type)*pbVar6;
      local_38 = (list_head *)CONCAT44(local_38._4_4_,nVar23);
      *memory = (char *)(pbVar6 + 1);
      *length = uVar26 - 1;
      if (uVar26 < 5) goto LAB_00103d96;
      puVar9 = (undefined1 *)((long)&local_58 + 3);
      local_58 = (nbt_list *)CONCAT44(local_58._4_4_,*(undefined4 *)(pbVar6 + 1));
      lVar14 = 0;
      do {
        uVar1 = *(undefined1 *)((long)&local_58 + lVar14);
        *(undefined1 *)((long)&local_58 + lVar14) = *puVar9;
        *puVar9 = uVar1;
        lVar14 = lVar14 + 1;
        puVar9 = puVar9 + -1;
      } while (lVar14 != 2);
      *memory = (char *)(pbVar6 + 5);
      nVar18 = TAG_COMPOUND;
      if (nVar23 != TAG_INVALID) {
        nVar18 = nVar23;
      }
      *length = uVar26 - 5;
      pnVar12->type = nVar18;
      if (0 < (int)local_58) {
        iVar25 = 0;
        local_48 = (nbt_list *)CONCAT44(local_48._4_4_,(int)local_58);
        local_40 = memory;
        do {
          puVar11 = (undefined8 *)malloc(0x18);
          if (puVar11 == (undefined8 *)0x0) {
            piVar13 = __errno_location();
            *piVar13 = -2;
LAB_00103d6a:
            iVar8 = 4;
            bVar27 = false;
          }
          else {
            pnVar12 = parse_unnamed_tag((nbt_type)local_38,(char *)0x0,local_40,length);
            *puVar11 = pnVar12;
            if (pnVar12 == (nbt_node *)0x0) {
              free(puVar11);
              goto LAB_00103d6a;
            }
            puVar11[2] = plVar22;
            plVar7 = plVar22->blink;
            puVar11[1] = plVar7;
            plVar22->blink = (list_head *)(puVar11 + 1);
            plVar7->flink = (list_head *)(puVar11 + 1);
            iVar8 = 0;
            bVar27 = true;
          }
          if (!bVar27) goto LAB_00103d84;
          iVar25 = iVar25 + 1;
        } while (iVar25 < (int)local_48);
        iVar8 = 0xb;
LAB_00103d84:
        if (iVar8 == 4) goto LAB_00103d96;
      }
    }
    (__ptr->payload).tag_list = pnVar20;
    goto LAB_00103e1f;
  case TAG_COMPOUND:
    local_48 = (nbt_list *)malloc(0x18);
    if (local_48 == (nbt_list *)0x0) {
      piVar13 = __errno_location();
      *piVar13 = -2;
    }
    else {
      local_48->data = (nbt_node *)0x0;
      local_38 = &local_48->entry;
      (local_48->entry).blink = local_38;
      (local_48->entry).flink = local_38;
      local_40 = memory;
      do {
        sVar21 = *length;
        iVar25 = 4;
        if (sVar21 != 0) {
          bVar2 = **local_40;
          *local_40 = *local_40 + 1;
          *length = sVar21 - 1;
          if (bVar2 == 0) {
            iVar25 = 5;
          }
          else {
            name_00 = read_string(local_40,length);
            if (name_00 != (char *)0x0) {
              puVar11 = (undefined8 *)malloc(0x18);
              if (puVar11 == (undefined8 *)0x0) {
                piVar13 = __errno_location();
                *piVar13 = -2;
              }
              else {
                pnVar12 = parse_unnamed_tag((uint)bVar2,name_00,local_40,length);
                *puVar11 = pnVar12;
                if (pnVar12 != (nbt_node *)0x0) {
                  puVar11[2] = local_38;
                  plVar22 = local_38->blink;
                  puVar11[1] = plVar22;
                  local_38->blink = (list_head *)(puVar11 + 1);
                  plVar22->flink = (list_head *)(puVar11 + 1);
                  iVar25 = 0;
                  goto LAB_0010396d;
                }
                free(puVar11);
              }
              free(name_00);
            }
          }
        }
LAB_0010396d:
      } while (iVar25 == 0);
      pnVar20 = local_48;
      if ((iVar25 == 1) || (iVar25 == 5)) goto LAB_00103dde;
    }
    piVar13 = __errno_location();
    if (*piVar13 == 0) {
      *piVar13 = -1;
    }
    nbt_free_list(local_48);
    pnVar20 = (nbt_list *)0x0;
LAB_00103dde:
    (__ptr->payload).tag_long = (int64_t)pnVar20;
    goto LAB_00103e1f;
  case TAG_INT_ARRAY:
    local_58 = (nbt_list *)0x0;
    uVar26 = *length;
    local_40 = memory;
    if (3 < uVar26) {
      piVar13 = (int *)*memory;
      puVar9 = (undefined1 *)((long)&local_50 + 3);
      local_50 = *piVar13;
      lVar14 = 8;
      do {
        uVar1 = *(undefined1 *)((long)&local_58 + lVar14);
        *(undefined1 *)((long)&local_58 + lVar14) = *puVar9;
        iVar25 = local_50;
        *puVar9 = uVar1;
        lVar14 = lVar14 + 1;
        puVar9 = puVar9 + -1;
      } while (lVar14 != 10);
      piVar13 = piVar13 + 1;
      *memory = (char *)piVar13;
      pnVar20 = (nbt_list *)(uVar26 - 4);
      *length = (size_t)pnVar20;
      lVar14 = (long)local_50;
      if (-1 < lVar14) {
        local_48 = (nbt_list *)(lVar14 * 4);
        pnVar10 = (nbt_list *)malloc((size_t)local_48);
        local_58 = pnVar10;
        if (pnVar10 == (nbt_list *)0x0) goto LAB_00103de4;
        sVar21 = (long)pnVar20 - (long)local_48;
        if (local_48 <= pnVar20) {
          memcpy(pnVar10,piVar13,(size_t)local_48);
          *local_40 = (char *)((long)piVar13 + (long)local_48);
          *length = sVar21;
          if (iVar25 != 0) {
            puVar9 = (undefined1 *)((long)&pnVar10->data + 1);
            lVar15 = 0;
            do {
              puVar19 = (undefined1 *)((long)&pnVar10->data + lVar15 * 4 + 3);
              puVar24 = puVar9;
              do {
                uVar1 = puVar24[-1];
                puVar24[-1] = *puVar19;
                *puVar19 = uVar1;
                puVar19 = puVar19 + -1;
                bVar27 = puVar24 < puVar19;
                puVar24 = puVar24 + 1;
              } while (bVar27);
              lVar15 = lVar15 + 1;
              puVar9 = puVar9 + 4;
            } while (lVar15 != lVar14);
          }
          goto LAB_00103e10;
        }
      }
    }
    goto LAB_00103def;
  case TAG_LONG_ARRAY:
    local_58 = (nbt_list *)0x0;
    uVar26 = *length;
    local_40 = memory;
    if (3 < uVar26) {
      piVar13 = (int *)*memory;
      puVar9 = (undefined1 *)((long)&local_50 + 3);
      local_50 = *piVar13;
      lVar14 = 8;
      do {
        uVar1 = *(undefined1 *)((long)&local_58 + lVar14);
        *(undefined1 *)((long)&local_58 + lVar14) = *puVar9;
        iVar25 = local_50;
        *puVar9 = uVar1;
        lVar14 = lVar14 + 1;
        puVar9 = puVar9 + -1;
      } while (lVar14 != 10);
      piVar13 = piVar13 + 1;
      *memory = (char *)piVar13;
      pnVar20 = (nbt_list *)(uVar26 - 4);
      *length = (size_t)pnVar20;
      lVar14 = (long)local_50;
      if (-1 < lVar14) {
        local_48 = (nbt_list *)(lVar14 * 8);
        pnVar10 = (nbt_list *)malloc((size_t)local_48);
        local_58 = pnVar10;
        if (pnVar10 == (nbt_list *)0x0) goto LAB_00103de4;
        sVar21 = (long)pnVar20 - (long)local_48;
        if (local_48 <= pnVar20) {
          memcpy(pnVar10,piVar13,(size_t)local_48);
          *local_40 = (char *)((long)piVar13 + (long)local_48);
          *length = sVar21;
          if (iVar25 != 0) {
            puVar9 = (undefined1 *)((long)&pnVar10->data + 1);
            lVar15 = 0;
            do {
              puVar19 = (undefined1 *)((long)&pnVar10->data + lVar15 * 8 + 7);
              puVar24 = puVar9;
              do {
                uVar1 = puVar24[-1];
                puVar24[-1] = *puVar19;
                *puVar19 = uVar1;
                puVar19 = puVar19 + -1;
                bVar27 = puVar24 < puVar19;
                puVar24 = puVar24 + 1;
              } while (bVar27);
              lVar15 = lVar15 + 1;
              puVar9 = puVar9 + 8;
            } while (lVar15 != lVar14);
          }
          goto LAB_00103e10;
        }
      }
    }
LAB_00103def:
    piVar13 = __errno_location();
    if (*piVar13 == 0) {
      *piVar13 = -1;
    }
    free(local_58);
    local_58 = (nbt_list *)0x0;
LAB_00103e10:
    (__ptr->payload).tag_list = local_58;
    (__ptr->payload).tag_byte_array.length = local_50;
    goto LAB_00103e1f;
  default:
    goto switchD_0010370d_default;
  }
  *length = sVar21;
LAB_00103e1f:
  piVar13 = __errno_location();
  if (*piVar13 == 0) {
    return __ptr;
  }
switchD_0010370d_default:
  piVar13 = __errno_location();
  if (*piVar13 == 0) {
    *piVar13 = -1;
  }
  free(__ptr);
  return (nbt_node *)0x0;
}

Assistant:

static nbt_node* parse_unnamed_tag(nbt_type type, char* name, const char** memory, size_t* length)
{
    nbt_node* node;

    CHECKED_MALLOC(node, sizeof *node, goto parse_error);

    node->type = type;
    node->name = name;

#define COPY_INTO_PAYLOAD(payload_name) \
    READ_GENERIC(&node->payload.payload_name, sizeof node->payload.payload_name, swapped_memscan, goto parse_error);

    switch(type)
    {
    case TAG_BYTE:
        COPY_INTO_PAYLOAD(tag_byte);
        break;
    case TAG_SHORT:
        COPY_INTO_PAYLOAD(tag_short);
        break;
    case TAG_INT:
        COPY_INTO_PAYLOAD(tag_int);
        break;
    case TAG_LONG:
        COPY_INTO_PAYLOAD(tag_long);
        break;
    case TAG_FLOAT:
        COPY_INTO_PAYLOAD(tag_float);
        break;
    case TAG_DOUBLE:
        COPY_INTO_PAYLOAD(tag_double);
        break;
    case TAG_BYTE_ARRAY:
        node->payload.tag_byte_array = read_byte_array(memory, length);
        break;
    case TAG_INT_ARRAY:
        node->payload.tag_int_array = read_int_array(memory, length);
        break;
    case TAG_LONG_ARRAY:
        node->payload.tag_long_array = read_long_array(memory, length);
        break;
    case TAG_STRING:
        node->payload.tag_string = read_string(memory, length);
        break;
    case TAG_LIST:
        node->payload.tag_list = read_list(memory, length);
        break;
    case TAG_COMPOUND:
        node->payload.tag_compound = read_compound(memory, length);
        break;

    default:
        goto parse_error; /* Unknown node or TAG_END. Either way, we shouldn't be parsing this. */
    }

#undef COPY_INTO_PAYLOAD

    if(errno != NBT_OK) goto parse_error;

    return node;

parse_error:
    if(errno == NBT_OK)
        errno = NBT_ERR;

    free(node);
    return NULL;
}